

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerMSL::add_interface_block_pointer
          (CompilerMSL *this,uint32_t ib_var_id,StorageClass storage)

{
  uint32_t uVar1;
  bool bVar2;
  char *pcVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  char (*ts_1) [7];
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *puVar6;
  StorageClass local_128;
  byte local_122;
  byte local_121;
  TypedID<(spirv_cross::Types)0> local_114;
  string local_110;
  allocator local_e9;
  string local_e8;
  ID local_c8;
  int local_c4;
  TypedID<(spirv_cross::Types)0> local_c0;
  uint32_t local_bc;
  SPIRType *local_b8;
  SPIRType *pcp_type;
  ID local_a8;
  uint32_t pcp_type_id;
  allocator local_91;
  string local_90;
  ID local_70;
  int local_6c [2];
  TypedID<(spirv_cross::Types)0> local_64;
  uint32_t local_60;
  TypedID<(spirv_cross::Types)1> local_5c;
  SPIRType *local_58;
  SPIRType *ib_ptr_ptr_type;
  TypedID<(spirv_cross::Types)0> local_48;
  uint32_t ib_ptr_ptr_type_id;
  SPIRType *local_40;
  SPIRType *ib_ptr_type;
  SPIRType *pSStack_30;
  uint32_t ib_ptr_type_id;
  SPIRType *ib_type;
  uint32_t next_id;
  uint32_t ib_ptr_var_id;
  StorageClass storage_local;
  uint32_t ib_var_id_local;
  CompilerMSL *this_local;
  
  if (ib_var_id == 0) {
    this_local._4_4_ = 0;
  }
  else {
    next_id = storage;
    ib_ptr_var_id = ib_var_id;
    _storage_local = this;
    ib_type._0_4_ = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,3);
    pSStack_30 = Compiler::expression_type((Compiler *)this,ib_ptr_var_id);
    bVar2 = is_tesc_shader(this);
    if ((bVar2) ||
       ((bVar2 = is_tese_shader(this), uVar1 = (uint32_t)ib_type, bVar2 &&
        (((this->msl_options).raw_buffer_tese_input & 1U) != 0)))) {
      uVar1 = (uint32_t)ib_type;
      ib_ptr_type._4_4_ = (uint32_t)ib_type;
      ib_type._0_4_ = (uint32_t)ib_type + 1;
      local_40 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType_const&>
                           ((Compiler *)this,uVar1,pSStack_30);
      *(undefined4 *)&(local_40->super_IVariant).field_0xc = 0x20;
      ib_ptr_ptr_type_id =
           (uint32_t)
           TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_30->super_IVariant).self);
      (local_40->type_alias).id = ib_ptr_ptr_type_id;
      (local_40->parent_type).id = (local_40->type_alias).id;
      local_40->pointer = true;
      local_40->pointer_depth = local_40->pointer_depth + 1;
      if (next_id == 1) {
        bVar2 = is_tesc_shader(this);
        if ((!bVar2) || (local_121 = 1, ((this->msl_options).multi_patch_workgroup & 1U) == 0)) {
          bVar2 = is_tese_shader(this);
          local_122 = 0;
          if (bVar2) {
            local_122 = (this->msl_options).raw_buffer_tese_input;
          }
          local_121 = local_122;
        }
        local_128 = StorageClassWorkgroup;
        if ((local_121 & 1) != 0) {
          local_128 = StorageClassStorageBuffer;
        }
      }
      else {
        local_128 = StorageClassStorageBuffer;
      }
      local_40->storage = local_128;
      puVar6 = &(this->super_CompilerGLSL).super_Compiler.ir.meta;
      pmVar4 = ::std::
               unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
               ::operator[](puVar6,&(pSStack_30->super_IVariant).self);
      TypedID<(spirv_cross::Types)0>::TypedID(&local_48,ib_ptr_type._4_4_);
      pmVar5 = ::std::
               unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
               ::operator[](puVar6,&local_48);
      Meta::operator=(pmVar5,pmVar4);
      uVar1 = (uint32_t)ib_type;
      ib_ptr_ptr_type._4_4_ = (uint32_t)ib_type;
      ib_type._0_4_ = (uint32_t)ib_type + 1;
      local_58 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                           ((Compiler *)this,uVar1,local_40);
      TypedID<(spirv_cross::Types)1>::TypedID(&local_5c,ib_ptr_type._4_4_);
      (local_58->parent_type).id = local_5c.id;
      local_60 = (uint32_t)
                 TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_30->super_IVariant).self);
      (local_58->type_alias).id = local_60;
      local_58->storage = StorageClassFunction;
      pmVar4 = ::std::
               unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
               ::operator[](puVar6,&(pSStack_30->super_IVariant).self);
      TypedID<(spirv_cross::Types)0>::TypedID(&local_64,ib_ptr_ptr_type._4_4_);
      pmVar5 = ::std::
               unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
               ::operator[](puVar6,&local_64);
      Meta::operator=(pmVar5,pmVar4);
      ib_type._4_4_ = (uint32_t)ib_type;
      local_6c[1] = 7;
      local_6c[0] = 0;
      Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int>
                ((Compiler *)this,(uint32_t)ib_type,(uint *)((long)&ib_ptr_ptr_type + 4),
                 (StorageClass *)(local_6c + 1),local_6c);
      TypedID<(spirv_cross::Types)0>::TypedID(&local_70,ib_type._4_4_);
      pcVar3 = "gl_out";
      if (next_id == 1) {
        pcVar3 = "gl_in";
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_90,pcVar3,&local_91);
      Compiler::set_name((Compiler *)this,local_70,&local_90);
      ::std::__cxx11::string::~string((string *)&local_90);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_91);
      if (next_id == 1) {
        TypedID<(spirv_cross::Types)0>::TypedID(&local_a8,ib_type._4_4_);
        Compiler::set_decoration((Compiler *)this,local_a8,DecorationNonWritable,0);
      }
    }
    else {
      pcp_type._4_4_ = (uint32_t)ib_type;
      ib_type._0_4_ = (uint32_t)ib_type + 1;
      local_b8 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType_const&>
                           ((Compiler *)this,uVar1,pSStack_30);
      local_b8->basetype = ControlPointArray;
      local_bc = (uint32_t)
                 TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_30->super_IVariant).self);
      (local_b8->type_alias).id = local_bc;
      (local_b8->parent_type).id = (local_b8->type_alias).id;
      local_b8->storage = next_id;
      puVar6 = &(this->super_CompilerGLSL).super_Compiler.ir.meta;
      pmVar4 = ::std::
               unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
               ::operator[](puVar6,&(pSStack_30->super_IVariant).self);
      TypedID<(spirv_cross::Types)0>::TypedID(&local_c0,pcp_type._4_4_);
      pmVar5 = ::std::
               unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
               ::operator[](puVar6,&local_c0);
      Meta::operator=(pmVar5,pmVar4);
      ib_type._4_4_ = (uint32_t)ib_type;
      local_c4 = 0;
      ts_1 = (char (*) [7])&next_id;
      Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass&,int>
                ((Compiler *)this,(uint32_t)ib_type,(uint *)((long)&pcp_type + 4),
                 (StorageClass *)ts_1,&local_c4);
      TypedID<(spirv_cross::Types)0>::TypedID(&local_c8,ib_type._4_4_);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_e8,"gl_in",&local_e9);
      Compiler::set_name((Compiler *)this,local_c8,&local_e8);
      ::std::__cxx11::string::~string((string *)&local_e8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      join<std::__cxx11::string&,char_const(&)[7]>
                (&local_110,(spirv_cross *)&this->patch_stage_in_var_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".gl_in",ts_1)
      ;
      TypedID<(spirv_cross::Types)0>::TypedID(&local_114,ib_type._4_4_);
      pmVar4 = ::std::
               unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
               ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,&local_114);
      ::std::__cxx11::string::operator=
                ((string *)&(pmVar4->decoration).qualified_alias,(string *)&local_110);
      ::std::__cxx11::string::~string((string *)&local_110);
    }
    this_local._4_4_ = ib_type._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t CompilerMSL::add_interface_block_pointer(uint32_t ib_var_id, StorageClass storage)
{
	if (!ib_var_id)
		return 0;

	uint32_t ib_ptr_var_id;
	uint32_t next_id = ir.increase_bound_by(3);
	auto &ib_type = expression_type(ib_var_id);
	if (is_tesc_shader() || (is_tese_shader() && msl_options.raw_buffer_tese_input))
	{
		// Tessellation control per-vertex I/O is presented as an array, so we must
		// do the same with our struct here.
		uint32_t ib_ptr_type_id = next_id++;
		auto &ib_ptr_type = set<SPIRType>(ib_ptr_type_id, ib_type);
		ib_ptr_type.op = OpTypePointer;
		ib_ptr_type.parent_type = ib_ptr_type.type_alias = ib_type.self;
		ib_ptr_type.pointer = true;
		ib_ptr_type.pointer_depth++;
		ib_ptr_type.storage = storage == StorageClassInput ?
		                          ((is_tesc_shader() && msl_options.multi_patch_workgroup) ||
		                                   (is_tese_shader() && msl_options.raw_buffer_tese_input) ?
		                               StorageClassStorageBuffer :
		                               StorageClassWorkgroup) :
		                          StorageClassStorageBuffer;
		ir.meta[ib_ptr_type_id] = ir.meta[ib_type.self];
		// To ensure that get_variable_data_type() doesn't strip off the pointer,
		// which we need, use another pointer.
		uint32_t ib_ptr_ptr_type_id = next_id++;
		auto &ib_ptr_ptr_type = set<SPIRType>(ib_ptr_ptr_type_id, ib_ptr_type);
		ib_ptr_ptr_type.parent_type = ib_ptr_type_id;
		ib_ptr_ptr_type.type_alias = ib_type.self;
		ib_ptr_ptr_type.storage = StorageClassFunction;
		ir.meta[ib_ptr_ptr_type_id] = ir.meta[ib_type.self];

		ib_ptr_var_id = next_id;
		set<SPIRVariable>(ib_ptr_var_id, ib_ptr_ptr_type_id, StorageClassFunction, 0);
		set_name(ib_ptr_var_id, storage == StorageClassInput ? "gl_in" : "gl_out");
		if (storage == StorageClassInput)
			set_decoration(ib_ptr_var_id, DecorationNonWritable);
	}
	else
	{
		// Tessellation evaluation per-vertex inputs are also presented as arrays.
		// But, in Metal, this array uses a very special type, 'patch_control_point<T>',
		// which is a container that can be used to access the control point data.
		// To represent this, a special 'ControlPointArray' type has been added to the
		// SPIRV-Cross type system. It should only be generated by and seen in the MSL
		// backend (i.e. this one).
		uint32_t pcp_type_id = next_id++;
		auto &pcp_type = set<SPIRType>(pcp_type_id, ib_type);
		pcp_type.basetype = SPIRType::ControlPointArray;
		pcp_type.parent_type = pcp_type.type_alias = ib_type.self;
		pcp_type.storage = storage;
		ir.meta[pcp_type_id] = ir.meta[ib_type.self];

		ib_ptr_var_id = next_id;
		set<SPIRVariable>(ib_ptr_var_id, pcp_type_id, storage, 0);
		set_name(ib_ptr_var_id, "gl_in");
		ir.meta[ib_ptr_var_id].decoration.qualified_alias = join(patch_stage_in_var_name, ".gl_in");
	}
	return ib_ptr_var_id;
}